

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

int __thiscall
NNTreeImpl::withinLimits(NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  NNTreeDetails *pNVar2;
  QPDF *qpdf;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined8 extraout_RAX;
  uint uVar6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle limits;
  QPDFObjectHandle local_c0;
  string local_b0;
  element_type *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  element_type *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/Limits","");
  QPDFObjectHandle::getKey(&local_c0,(string *)node);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  bVar3 = QPDFObjectHandle::isArray(&local_c0);
  if (bVar3) {
    iVar5 = QPDFObjectHandle::getArrayNItems(&local_c0);
    if (1 < iVar5) {
      pNVar2 = this->details;
      QVar7 = QPDFObjectHandle::getArrayItem(&local_70,(int)&local_c0);
      cVar4 = (**(code **)(*(long *)pNVar2 + 8))
                        (pNVar2,&local_70,
                         QVar7.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
      if (cVar4 == '\0') {
        if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      else {
        pNVar2 = this->details;
        QVar7 = QPDFObjectHandle::getArrayItem(&local_40,(int)&local_c0);
        cVar4 = (**(code **)(*(long *)pNVar2 + 8))
                          (pNVar2,&local_40,
                           QVar7.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
        if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (cVar4 != '\0') {
          pNVar2 = this->details;
          local_80 = (key->super_BaseHandle).obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_78 = (key->super_BaseHandle).obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_78->_M_use_count = local_78->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_78->_M_use_count = local_78->_M_use_count + 1;
            }
          }
          QPDFObjectHandle::getArrayItem(&local_50,(int)&local_c0);
          iVar5 = (**(code **)(*(long *)pNVar2 + 0x10))(pNVar2,&local_80,&local_50);
          if (local_50.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
          }
          if (iVar5 < 0) {
            uVar6 = 0xffffffff;
          }
          else {
            pNVar2 = this->details;
            local_90 = (key->super_BaseHandle).obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_88 = (key->super_BaseHandle).obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_88->_M_use_count = local_88->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_88->_M_use_count = local_88->_M_use_count + 1;
              }
            }
            QPDFObjectHandle::getArrayItem(&local_60,(int)&local_c0);
            iVar5 = (**(code **)(*(long *)pNVar2 + 0x10))(pNVar2,&local_90,&local_60);
            if (local_60.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_60.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
            }
            uVar6 = (uint)(0 < iVar5);
          }
          if (local_c0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          return uVar6;
        }
      }
    }
  }
  qpdf = this->qpdf;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"node is missing /Limits","");
  ::error(qpdf,node,&local_b0);
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
NNTreeImpl::withinLimits(QPDFObjectHandle key, QPDFObjectHandle node)
{
    int result = 0;
    auto limits = node.getKey("/Limits");
    if (limits.isArray() && (limits.getArrayNItems() >= 2) &&
        details.keyValid(limits.getArrayItem(0)) && details.keyValid(limits.getArrayItem(1))) {
        if (details.compareKeys(key, limits.getArrayItem(0)) < 0) {
            result = -1;
        } else if (details.compareKeys(key, limits.getArrayItem(1)) > 0) {
            result = 1;
        }
    } else {
        QTC::TC("qpdf", "NNTree missing limits");
        error(qpdf, node, "node is missing /Limits");
    }
    return result;
}